

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

ON_BoundingBox * __thiscall
ON_Brep::InternalBrepBoundingBox
          (ON_BoundingBox *__return_storage_ptr__,ON_Brep *this,bool bLazy,bool bUpdateCachedBBox)

{
  bool bVar1;
  int iVar2;
  ON_BrepFace *pOVar3;
  undefined1 local_88 [8];
  ON_BoundingBox face_bbox;
  ON_BrepFace *f;
  int fi;
  int face_count;
  ON_BoundingBox brep_bbox;
  bool bUpdateCachedBBox_local;
  bool bLazy_local;
  ON_Brep *this_local;
  
  brep_bbox.m_max.z._6_1_ = bUpdateCachedBBox;
  brep_bbox.m_max.z._7_1_ = bLazy;
  if ((bLazy) && (bVar1 = ON_BoundingBox::IsNotEmpty(&this->m_bbox), bVar1)) {
    memcpy(__return_storage_ptr__,&this->m_bbox,0x30);
  }
  else {
    ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)&fi);
    iVar2 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F);
    for (f._0_4_ = 0; (int)f < iVar2; f._0_4_ = (int)f + 1) {
      pOVar3 = ON_ClassArray<ON_BrepFace>::operator[]
                         ((ON_ClassArray<ON_BrepFace> *)&this->m_F,(int)f);
      if ((pOVar3->m_face_index != -1) &&
         (face_bbox.m_max.z = (double)Face(this,(int)f),
         (ON_BrepFace *)face_bbox.m_max.z != (ON_BrepFace *)0x0)) {
        ON_BrepFace::InternalFaceBoundingBox
                  ((ON_BoundingBox *)local_88,(ON_BrepFace *)face_bbox.m_max.z,
                   (bool)(brep_bbox.m_max.z._7_1_ & 1),(bool)(brep_bbox.m_max.z._6_1_ & 1));
        bVar1 = ON_BoundingBox::IsNotEmpty((ON_BoundingBox *)local_88);
        if (bVar1) {
          ON_BoundingBox::Union((ON_BoundingBox *)&fi,(ON_BoundingBox *)local_88);
        }
      }
    }
    bVar1 = ON_BoundingBox::IsNotEmpty((ON_BoundingBox *)&fi);
    if (bVar1) {
      if ((brep_bbox.m_max.z._6_1_ & 1) != 0) {
        memcpy(&this->m_bbox,&fi,0x30);
      }
      memcpy(__return_storage_ptr__,&fi,0x30);
    }
    else {
      memcpy(__return_storage_ptr__,&ON_BoundingBox::EmptyBoundingBox,0x30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_BoundingBox ON_Brep::InternalBrepBoundingBox(bool bLazy, bool bUpdateCachedBBox) const
{
  if (bLazy && m_bbox.IsNotEmpty())
    return m_bbox;

  ON_BoundingBox brep_bbox;
  const int face_count = m_F.Count();
  int fi;
  for (fi = 0; fi < face_count; fi++)
  {
    if (m_F[fi].m_face_index == -1)
      continue;

    //GBA 20 May 2020. RH-58462. Brep box now computed from face boxes, instead of surface boxes.
    const ON_BrepFace* f = Face(fi);
    if (nullptr == f)
      continue;

    const ON_BoundingBox face_bbox = f->InternalFaceBoundingBox(bLazy, bUpdateCachedBBox);
    if (false == face_bbox.IsNotEmpty())
      continue;

    brep_bbox.Union(face_bbox);
  }

  if (false == brep_bbox.IsNotEmpty())
  {
    // ON_Brep code has always used ON_BoundingBox::EmptyBoundingBox 
    // to indicate a bounding box is not set. If it were to be written
    // in modern times, it would have used Nans.
    return ON_BoundingBox::EmptyBoundingBox;
  }

  if (bUpdateCachedBBox)
    const_cast<ON_Brep*>(this)->m_bbox = brep_bbox;
  return brep_bbox;
}